

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O0

void __thiscall HighsNodeQueue::setNumCol(HighsNodeQueue *this,HighsInt numCol)

{
  AllocatorState *this_00;
  pointer state;
  int in_ESI;
  set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
  *in_RDI;
  HighsInt i;
  NodesetAllocator<std::pair<double,_long>_> allocator;
  int local_34;
  NodesetAllocator<std::pair<double,_long>_> in_stack_ffffffffffffffd0;
  
  if (*(int *)&in_RDI[2]._M_t._M_impl.super__Rb_tree_header._M_header._M_left != in_ESI) {
    *(int *)&in_RDI[2]._M_t._M_impl.super__Rb_tree_header._M_header._M_left = in_ESI;
    this_00 = (AllocatorState *)operator_new(0x20);
    memset(this_00,0,0x20);
    AllocatorState::AllocatorState(this_00);
    std::
    unique_ptr<HighsNodeQueue::AllocatorState,std::default_delete<HighsNodeQueue::AllocatorState>>::
    unique_ptr<std::default_delete<HighsNodeQueue::AllocatorState>,void>
              ((unique_ptr<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
                *)in_RDI,this_00);
    std::
    unique_ptr<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
    ::operator=((unique_ptr<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
                 *)in_RDI,
                (unique_ptr<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
                 *)this_00);
    std::
    unique_ptr<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
    ::~unique_ptr((unique_ptr<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
                   *)in_stack_ffffffffffffffd0.state);
    if (in_ESI != 0) {
      operator_new((long)in_ESI * 0x38);
      std::
      unique_ptr<std::set<std::pair<double,long>,std::less<std::pair<double,long>>,HighsNodeQueue::NodesetAllocator<std::pair<double,long>>>,HighsNodeQueue::GlobalOperatorDelete>
      ::unique_ptr<HighsNodeQueue::GlobalOperatorDelete,void>
                ((unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                  *)in_RDI,(pointer)this_00);
      std::
      unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
      ::operator=((unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                   *)in_RDI,
                  (unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                   *)this_00);
      std::
      unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
      ::~unique_ptr((unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                     *)in_stack_ffffffffffffffd0.state);
      operator_new((long)in_ESI * 0x38);
      std::
      unique_ptr<std::set<std::pair<double,long>,std::less<std::pair<double,long>>,HighsNodeQueue::NodesetAllocator<std::pair<double,long>>>,HighsNodeQueue::GlobalOperatorDelete>
      ::unique_ptr<HighsNodeQueue::GlobalOperatorDelete,void>
                ((unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                  *)in_RDI,(pointer)this_00);
      std::
      unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
      ::operator=((unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                   *)in_RDI,
                  (unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                   *)this_00);
      std::
      unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
      ::~unique_ptr((unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                     *)in_stack_ffffffffffffffd0.state);
      state = std::
              unique_ptr<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
              ::get((unique_ptr<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
                     *)in_RDI);
      NodesetAllocator<std::pair<double,_long>_>::NodesetAllocator
                ((NodesetAllocator<std::pair<double,_long>_> *)&stack0xffffffffffffffd0,state);
      for (local_34 = 0; local_34 < in_ESI; local_34 = local_34 + 1) {
        std::
        unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
        ::get((unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
               *)in_RDI);
        std::
        set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
        ::set(in_RDI,(allocator_type *)this_00);
        std::
        unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
        ::get((unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
               *)in_RDI);
        std::
        set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
        ::set(in_RDI,(allocator_type *)this_00);
      }
    }
  }
  return;
}

Assistant:

void HighsNodeQueue::setNumCol(HighsInt numCol) {
  if (this->numCol == numCol) return;
  this->numCol = numCol;
  allocatorState = std::unique_ptr<AllocatorState>(new AllocatorState());

  if (numCol == 0) return;
  colLowerNodesPtr =
      NodeSetArray((NodeSet*)::operator new(sizeof(NodeSet) * numCol));
  colUpperNodesPtr =
      NodeSetArray((NodeSet*)::operator new(sizeof(NodeSet) * numCol));

  NodesetAllocator<std::pair<double, int64_t>> allocator(allocatorState.get());
  for (HighsInt i = 0; i < numCol; ++i) {
    new (colLowerNodesPtr.get() + i) NodeSet(allocator);
    new (colUpperNodesPtr.get() + i) NodeSet(allocator);
  }
}